

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::GetterXRefYs<unsigned_int>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  uint uVar5;
  ImU32 IVar6;
  GetterXRefYs<unsigned_int> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  ImDrawIdx IVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar12 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  uVar5 = *(uint *)((long)pGVar7->Ys +
                   (long)(((pGVar7->Offset + prim) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride)
  ;
  dVar20 = log10(pGVar7->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = GImPlot;
  pIVar9 = pIVar12->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  fVar16 = (float)((((double)(float)(dVar20 / pIVar12->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar4].Min.x);
  fVar17 = (float)(((double)uVar5 - pIVar9->YAxis[iVar4].Range.Min) * pIVar12->My[iVar4] +
                  (double)pIVar12->PixelRange[iVar4].Min.y);
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar4 = pGVar7->Count;
  uVar5 = *(uint *)((long)pGVar7->Ys +
                   (long)(((prim + pGVar7->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride)
  ;
  dVar20 = log10(pGVar7->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar13->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  fVar21 = (float)((((double)(float)(dVar20 / pIVar13->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar4].Min.x);
  fVar22 = (float)(((double)uVar5 - pIVar9->YAxis[iVar4].Range.Min) * pIVar13->My[iVar4] +
                  (double)pIVar13->PixelRange[iVar4].Min.y);
  fVar18 = fVar17;
  if (fVar22 <= fVar17) {
    fVar18 = fVar22;
  }
  bVar15 = false;
  if ((fVar18 < (cull_rect->Max).y) &&
     (fVar18 = (float)(~-(uint)(fVar22 <= fVar17) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar18 && fVar18 != *pfVar1)) {
    fVar18 = fVar16;
    if (fVar21 <= fVar16) {
      fVar18 = fVar21;
    }
    bVar15 = false;
    if (fVar18 < (cull_rect->Max).x) {
      fVar18 = (float)(~-(uint)(fVar21 <= fVar16) & (uint)fVar21 |
                      -(uint)(fVar21 <= fVar16) & (uint)fVar16);
      bVar15 = (cull_rect->Min).x <= fVar18 && fVar18 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar18 = this->Weight;
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar23 = fVar21 - fVar16;
    fVar24 = fVar22 - fVar17;
    fVar19 = fVar23 * fVar23 + fVar24 * fVar24;
    if (0.0 < fVar19) {
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      fVar23 = fVar23 * (1.0 / fVar19);
      fVar24 = fVar24 * (1.0 / fVar19);
    }
    fVar18 = fVar18 * 0.5;
    fVar23 = fVar23 * fVar18;
    fVar18 = fVar18 * fVar24;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar18 + fVar16;
    (pIVar10->pos).y = fVar17 - fVar23;
    pIVar10->uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar18 + fVar21;
    pIVar10[1].pos.y = fVar22 - fVar23;
    pIVar10[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar21 - fVar18;
    pIVar10[2].pos.y = fVar23 + fVar22;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar16 - fVar18;
    pIVar10[3].pos.y = fVar23 + fVar17;
    pIVar10[3].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar14 = (ImDrawIdx)uVar5;
    *pIVar11 = IVar14;
    pIVar11[1] = IVar14 + 1;
    pIVar11[2] = IVar14 + 2;
    pIVar11[3] = IVar14;
    pIVar11[4] = IVar14 + 2;
    pIVar11[5] = IVar14 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar5 + 4;
  }
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }